

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_recv_op_base<std::experimental::net::v1::mutable_buffer>::do_perform
                 (reactor_op *base)

{
  bool bVar1;
  long in_RDI;
  status result;
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  bufs;
  reactive_socket_recv_op_base<std::experimental::net::v1::mutable_buffer> *o;
  size_t *in_stack_00000050;
  mutable_buffer *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  status sVar2;
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  local_28;
  long local_10;
  
  local_10 = in_RDI;
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  ::buffer_sequence_adapter
            ((buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
              *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  ::buffers(&local_28);
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  ::count(&local_28);
  bVar1 = socket_ops::non_blocking_recv
                    ((socket_type)base,(buf *)o,bufs.total_buffer_size_,bufs.buffer_.iov_len._4_4_,
                     bufs.buffer_.iov_len._3_1_,(error_code *)bufs.buffer_.iov_base,
                     in_stack_00000050);
  sVar2 = (status)bVar1;
  if (((sVar2 == done) && ((*(byte *)(local_10 + 0x3c) & 0x10) != 0)) &&
     (*(long *)(local_10 + 0x28) == 0)) {
    sVar2 = done_and_exhausted;
  }
  return sVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }